

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbd_merge2image.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  _InputArray *p_Var7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  float fVar15;
  double dVar16;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  Mat colorf;
  Mat edges;
  Mat lbd;
  Mat dashMask;
  Mat color;
  Mat src;
  Mat dy;
  Mat dx;
  Mat sobel;
  allocator local_779;
  float local_778;
  float local_774;
  ulong local_770;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_768;
  char **local_750;
  ulong local_748;
  Mat *local_740;
  void *local_738;
  undefined8 uStack_730;
  long local_728;
  long *local_718;
  string *psStack_710;
  Size SStack_708;
  undefined8 uStack_700;
  Mat local_6a8 [96];
  Mat local_648 [144];
  ulong local_5b8;
  ulong local_5b0;
  _OutputArray local_5a8 [3];
  long *local_560;
  _OutputArray local_548 [2];
  ulong *local_508;
  _InputArray local_4e8;
  Mat local_4d0 [8];
  int local_4c8;
  int local_4c4;
  long local_4c0;
  long *local_488;
  undefined1 local_470 [16];
  Size SStack_460;
  Mat local_400 [96];
  Mat aMStack_3a0 [144];
  string local_310 [16];
  long local_300;
  int *local_2d0;
  undefined1 local_2b0 [16];
  Size SStack_2a0;
  Mat local_240 [96];
  Mat local_1e0 [144];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  if (argc < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Missing arguments!\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1070e0);
    }
    else {
      sVar6 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," lbd_image image_to_merge result",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    iVar5 = 1;
  }
  else {
    local_774 = 0.2;
    iVar5 = 3;
    local_778 = 0.7;
    bVar13 = true;
    while( true ) {
      while( true ) {
        iVar4 = getopt(argc,argv,"a:ds:t:");
        if (iVar4 < 100) break;
        if (iVar4 == 100) {
          bVar13 = false;
        }
        else if (iVar4 == 0x73) {
          iVar5 = atoi(_optarg);
        }
        else if (iVar4 == 0x74) {
          dVar3 = atof(_optarg);
          dVar3 = (double)(float)dVar3;
          if (dVar3 <= 0.0) {
            dVar3 = 0.0;
          }
          dVar16 = 1.0;
          if (dVar3 <= 1.0) {
            dVar16 = dVar3;
          }
          local_774 = (float)dVar16;
        }
      }
      if (iVar4 == -1) break;
      if (iVar4 == 0x61) {
        dVar3 = atof(_optarg);
        local_778 = (float)dVar3;
      }
    }
    local_770 = (ulong)(uint)argc;
    std::__cxx11::string::string((string *)&local_718,argv[local_770 - 3],(allocator *)local_470);
    cv::imread((string *)local_548,(int)(_InputArray *)&local_718);
    if ((Size *)local_718 != &SStack_708) {
      operator_delete(local_718,(long)SStack_708 + 1);
    }
    if (local_548[0].super__InputArray.sz == (Size)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error reading; ",0xf);
      pcVar1 = argv[local_770 - 3];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1070e0);
      }
      else {
        sVar6 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
      std::ostream::put(-0x20);
      iVar5 = 1;
      std::ostream::flush();
    }
    else {
      std::__cxx11::string::string((string *)&local_718,argv[local_770 - 2],(allocator *)local_470);
      cv::imread(local_310,(int)(_InputArray *)&local_718);
      if ((Size *)local_718 != &SStack_708) {
        operator_delete(local_718,(long)SStack_708 + 1);
      }
      if (local_300 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error reading; ",0xf);
        pcVar1 = argv[local_770 - 2];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1070e0);
        }
        else {
          sVar6 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar6);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
        std::ostream::put(-0x20);
        iVar5 = 1;
        std::ostream::flush();
      }
      else {
        if ((*(int *)((long)local_508 + 4) != local_2d0[1]) || ((int)*local_508 != *local_2d0)) {
          cv::Mat::Mat((Mat *)&local_718);
          SStack_460.width = 0;
          SStack_460.height = 0;
          local_470._0_4_ = 0x1010000;
          SStack_2a0.width = 0;
          SStack_2a0.height = 0;
          local_2b0._0_4_ = 0x2010000;
          local_5b0 = *local_508 << 0x20 | *local_508 >> 0x20;
          local_470._8_8_ = local_310;
          local_2b0._8_8_ = (_InputArray *)&local_718;
          cv::resize(0);
          SStack_460.width = 0;
          SStack_460.height = 0;
          local_470._0_4_ = 0x2010000;
          local_470._8_8_ = local_310;
          cv::Mat::copyTo((_OutputArray *)&local_718);
          cv::Mat::~Mat((Mat *)&local_718);
        }
        cv::Mat::Mat(local_f0);
        cv::Mat::Mat(local_150);
        SStack_708.width = 0;
        SStack_708.height = 0;
        local_718._0_4_ = 0x1010000;
        SStack_460.width = 0;
        SStack_460.height = 0;
        local_470._0_4_ = 0x2010000;
        psStack_710 = local_310;
        local_470._8_8_ = local_f0;
        cv::Sobel((_InputArray *)&local_718,(_OutputArray *)local_470,5,1,0,iVar5,1.0,0.0,4);
        SStack_708.width = 0;
        SStack_708.height = 0;
        local_718._0_4_ = 0x1010000;
        SStack_460.width = 0;
        SStack_460.height = 0;
        local_470._0_4_ = 0x2010000;
        psStack_710 = local_310;
        local_470._8_8_ = local_150;
        cv::Sobel((_InputArray *)&local_718,(_OutputArray *)local_470,5,0,1,iVar5,1.0,0.0,4);
        SStack_708.width = 0;
        SStack_708.height = 0;
        local_718._0_4_ = 0x1010000;
        SStack_460.width = 0;
        SStack_460.height = 0;
        local_470._0_4_ = 0x1010000;
        SStack_2a0.width = 0;
        SStack_2a0.height = 0;
        local_2b0._0_4_ = 0x2010000;
        psStack_710 = (string *)local_f0;
        local_470._8_8_ = local_f0;
        local_2b0._8_8_ = local_f0;
        cv::multiply((_InputArray *)&local_718,(_InputArray *)local_470,(_OutputArray *)local_2b0,
                     1.0,-1);
        SStack_708.width = 0;
        SStack_708.height = 0;
        local_718 = (long *)CONCAT44(local_718._4_4_,0x1010000);
        SStack_460.width = 0;
        SStack_460.height = 0;
        local_470._0_4_ = 0x1010000;
        SStack_2a0.width = 0;
        SStack_2a0.height = 0;
        local_2b0._0_4_ = 0x2010000;
        psStack_710 = (string *)local_150;
        local_470._8_8_ = local_150;
        local_2b0._8_8_ = local_150;
        cv::multiply((_InputArray *)&local_718,(_InputArray *)local_470,(_OutputArray *)local_2b0,
                     1.0,-1);
        cv::Mat::Mat((Mat *)local_5a8);
        cv::operator+((Mat *)&local_718,local_f0);
        (**(code **)(*local_718 + 0x18))(local_718,(_InputArray *)&local_718,local_5a8,0xffffffff);
        cv::Mat::~Mat(local_648);
        cv::Mat::~Mat(local_6a8);
        cv::Mat::~Mat((Mat *)&SStack_708);
        SStack_708.width = 0;
        SStack_708.height = 0;
        local_718 = (long *)CONCAT44(local_718._4_4_,0x1010000);
        SStack_460.width = 0;
        SStack_460.height = 0;
        local_470._0_4_ = 0x2010000;
        psStack_710 = (string *)local_5a8;
        local_470._8_8_ = local_5a8;
        cv::sqrt((_InputArray *)&local_718,(_OutputArray *)local_470);
        cv::abs((Mat *)&local_718);
        (**(code **)(*local_718 + 0x18))(local_718,(_InputArray *)&local_718,local_5a8,0xffffffff);
        cv::Mat::~Mat(local_648);
        cv::Mat::~Mat(local_6a8);
        cv::Mat::~Mat((Mat *)&SStack_708);
        SStack_708.width = 0;
        SStack_708.height = 0;
        local_718._0_4_ = 0x1010000;
        SStack_460.width = 0;
        SStack_460.height = 0;
        local_470._0_4_ = 0x3010000;
        psStack_710 = (string *)local_5a8;
        local_470._8_8_ = local_5a8;
        p_Var7 = (_InputArray *)cv::noArray();
        cv::normalize((_InputArray *)&local_718,(_InputOutputArray *)local_470,0.0,1.0,0x20,-1,
                      p_Var7);
        cv::Mat::Mat(local_90);
        SStack_708.width = 0;
        SStack_708.height = 0;
        local_718 = (long *)CONCAT44(local_718._4_4_,0x2010000);
        psStack_710 = (string *)local_90;
        cv::Mat::convertTo(local_5a8,(int)(_InputArray *)&local_718,255.0,0.0);
        local_5b8 = *local_508 << 0x20 | *local_508 >> 0x20;
        local_718 = (long *)0x3ff0000000000000;
        psStack_710 = (string *)0x0;
        SStack_708.width = 0;
        SStack_708.height = 0;
        uStack_700 = 0;
        cv::Mat::Mat(local_4d0,&local_5b8,5);
        if ((!bVar13) && (0 < (long)local_4c8)) {
          lVar14 = *local_488;
          lVar8 = 0;
          do {
            if (0 < local_4c4) {
              lVar10 = 0;
              do {
                fVar15 = 1.0;
                if ((((uint)lVar10 ^ (uint)lVar8) & 2) != 0) {
                  fVar15 = 0.0;
                }
                *(float *)(local_4c0 + lVar10 * 4) = fVar15 * *(float *)(local_4c0 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (local_4c4 != (int)lVar10);
            }
            lVar8 = lVar8 + 1;
            local_4c0 = local_4c0 + lVar14;
          } while (lVar8 != local_4c8);
        }
        SStack_708.width = 0;
        SStack_708.height = 0;
        local_718 = (long *)CONCAT44(local_718._4_4_,0x1010000);
        SStack_460.width = 0;
        SStack_460.height = 0;
        local_470._0_4_ = 0x1010000;
        SStack_2a0.width = 0;
        SStack_2a0.height = 0;
        local_2b0._0_4_ = 0x2010000;
        psStack_710 = (string *)local_5a8;
        local_470._8_8_ = local_4d0;
        local_2b0._8_8_ = local_5a8;
        cv::multiply((_InputArray *)&local_718,(_InputArray *)local_470,(_OutputArray *)local_2b0,
                     1.0,-1);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
                  (&local_768,3,(allocator_type *)&local_718);
        lVar14 = 0;
        do {
          psStack_710 = (string *)
                        (local_768.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
          SStack_708.width = 0;
          SStack_708.height = 0;
          local_718 = (long *)CONCAT44(local_718._4_4_,0x2010000);
          cv::Mat::convertTo(local_548,(int)(_InputArray *)&local_718,0.00392156862745098,0.0);
          lVar14 = lVar14 + 0x60;
        } while (lVar14 != 0x120);
        local_748 = (ulong)(uint)local_548[0].super__InputArray.obj;
        local_740 = local_648;
        lVar14 = 0;
        local_750 = argv;
        do {
          cv::operator*(1.0,(Mat *)local_470);
          cv::operator*(0.0,(Mat *)local_2b0);
          cv::operator+((MatExpr *)&local_718,(MatExpr *)local_470);
          (**(code **)(*local_718 + 0x18))
                    (local_718,(_InputArray *)&local_718,
                     local_768.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar14,0xffffffff);
          cv::Mat::~Mat(local_740);
          cv::Mat::~Mat(local_6a8);
          cv::Mat::~Mat((Mat *)&SStack_708);
          cv::Mat::~Mat(local_1e0);
          cv::Mat::~Mat(local_240);
          cv::Mat::~Mat((Mat *)(local_2b0 + 0x10));
          cv::Mat::~Mat(aMStack_3a0);
          cv::Mat::~Mat(local_400);
          cv::Mat::~Mat((Mat *)(local_470 + 0x10));
          lVar14 = lVar14 + 0x60;
        } while (lVar14 != 0x120);
        if (0 < (int)local_748) {
          lVar14 = *local_560;
          lVar8 = *(long *)(local_768.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x70);
          lVar10 = **(long **)(local_768.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start + 0xa8);
          lVar9 = *(long *)(local_768.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + 0xd0);
          lVar2 = **(long **)(local_768.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start + 0x108);
          uVar11 = 0;
          do {
            if (0 < local_548[0].super__InputArray.obj._4_4_) {
              lVar12 = 0;
              do {
                if (local_774 <= *(float *)((long)local_5a8[0].super__InputArray.sz + lVar12 * 4)) {
                  *(float *)(lVar9 + lVar12 * 4) =
                       *(float *)(lVar9 + lVar12 * 4) * (1.0 - local_778) + local_778;
                  *(float *)(lVar8 + lVar12 * 4) =
                       *(float *)(lVar8 + lVar12 * 4) * (1.0 - local_778) + local_778;
                }
                lVar12 = lVar12 + 1;
              } while (local_548[0].super__InputArray.obj._4_4_ != (int)lVar12);
            }
            uVar11 = uVar11 + 1;
            lVar9 = lVar9 + lVar2;
            lVar8 = lVar8 + lVar10;
            local_5a8[0].super__InputArray.sz =
                 (Size)((long)local_5a8[0].super__InputArray.sz + lVar14);
          } while (uVar11 != local_748);
        }
        cv::Mat::Mat((Mat *)&local_718);
        cv::Mat::Mat((Mat *)local_470);
        SStack_2a0.width = 0;
        SStack_2a0.height = 0;
        local_2b0._0_4_ = 0x1050000;
        local_4e8.sz.width = 0;
        local_4e8.sz.height = 0;
        local_4e8.flags = 0x2010000;
        local_4e8.obj = (_InputArray *)&local_718;
        local_2b0._8_8_ = &local_768;
        cv::merge((_InputArray *)local_2b0,(_OutputArray *)&local_4e8);
        SStack_2a0.width = 0;
        SStack_2a0.height = 0;
        local_2b0._0_4_ = 0x2010000;
        local_2b0._8_8_ = (_InputArray *)local_470;
        cv::Mat::convertTo((_OutputArray *)&local_718,(int)local_2b0,255.0,0.0);
        std::__cxx11::string::string((string *)local_2b0,local_750[local_770 - 1],&local_779);
        local_4e8.sz.width = 0;
        local_4e8.sz.height = 0;
        local_4e8.flags = 0x1010000;
        local_728 = 0;
        local_738 = (void *)0x0;
        uStack_730 = 0;
        local_4e8.obj = (_InputArray *)local_470;
        cv::imwrite((string *)local_2b0,&local_4e8,(vector *)&local_738);
        if (local_738 != (void *)0x0) {
          operator_delete(local_738,local_728 - (long)local_738);
        }
        if ((undefined1 *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_) != local_2b0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_),
                          (long)SStack_2a0 + 1);
        }
        cv::Mat::~Mat((Mat *)local_470);
        cv::Mat::~Mat((Mat *)&local_718);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_768);
        cv::Mat::~Mat(local_4d0);
        cv::Mat::~Mat(local_90);
        cv::Mat::~Mat((Mat *)local_5a8);
        cv::Mat::~Mat(local_150);
        cv::Mat::~Mat(local_f0);
        iVar5 = 0;
      }
      cv::Mat::~Mat((Mat *)local_310);
    }
    cv::Mat::~Mat((Mat *)local_548);
  }
  return iVar5;
}

Assistant:

int main(int argc, char * const argv[])
{
  if (argc < 4)
  {
    std::cerr << "Missing arguments!\n";
    std::cerr << "Usage: " << argv[0] << " lbd_image image_to_merge result" << std::endl;
    return EXIT_FAILURE;
  }

  float threshold = 0.2;
  int sobelSize = 3;
  int dash = 0;
  float alpha = 0.7;

  int c = 0;
  while ( (c = getopt(argc, argv, "a:ds:t:")) != -1 )
  {
    switch (c)
    {
    case 'a':
      alpha = (float)atof(optarg);
      break;

    case 'd':
      dash = 1;
      break;

    case 's':
      sobelSize = atoi(optarg);
      break;

    case 't':
      threshold = (float)atof(optarg);
      threshold = MIN(MAX(0.0, threshold), 1.0);
      break;

    default:
      break;
    }
  }

  // Read LBD image
  cv::Mat lbd = cv::imread(argv[argc-3], 0);
  if (!lbd.data)
  {
    std::cerr << "Error reading; " << argv[argc-3] << std::endl;
    return EXIT_FAILURE;
  }

  // Read src image
  cv::Mat src = cv::imread(argv[argc-2], 0);
  if (!src.data)
  {
    std::cerr << "Error reading; " << argv[argc-2] << std::endl;
    return EXIT_FAILURE;
  }

  if (lbd.size() != src.size())
  {
    cv::Mat tmp;
    cv::resize(src, tmp, lbd.size());
    tmp.copyTo(src);
  }

  // Take gradient
  cv::Mat dx, dy;
  cv::Sobel(src, dx, CV_32F, 1, 0, sobelSize);
  cv::Sobel(src, dy, CV_32F, 0, 1, sobelSize);
  cv::multiply(dx, dx, dx);
  cv::multiply(dy, dy, dy);
  cv::Mat edges;
  edges = dx + dy;
  cv::sqrt(edges, edges);
  edges = cv::abs(edges);
  cv::normalize(edges, edges, 0, 1, cv::NORM_MINMAX);

  cv::Mat sobel;
  edges.convertTo(sobel, CV_8U, 255.0);

  // Create mask if needed
  cv::Mat dashMask(lbd.size(), CV_32FC1, cv::Scalar(1.0));
  if (dash > 0)
  {
    for (int y = 0; y < dashMask.rows; ++y)
    {
      int testValue = (y/2) % 2;
      float *p_dash = dashMask.ptr<float>(y);

      for (int x = 0; x < dashMask.cols; ++x)
        *p_dash++ *= ((x/2)%2 == testValue);
    }
  }
  cv::multiply(edges, dashMask, edges);

  // Merge step
  std::vector<cv::Mat> planes(3);
  for (int i = 0; i < 3; ++i)
    lbd.convertTo(planes[i], CV_32F, 1.0/255.0);

  int width = lbd.cols;
  int height = lbd.rows;

  for (int i = 0; i < 3; ++i)
    planes[i] = 1.0*planes[i] + 0.0*edges;

  for (int y = 0; y < height; ++y)
  {
    float const *p_edges = edges.ptr<float>(y);
    float *p_blue = planes[0].ptr<float>(y);
    float *p_green = planes[1].ptr<float>(y);
    float *p_red = planes[2].ptr<float>(y);

    for (int x = 0; x < width; ++x)
    {
      if (*p_edges >= threshold)
      {
        *p_red = alpha + (1.0-alpha)*(*p_red);
        *p_green = alpha + (1.0-alpha)*(*p_green);
      }
      p_blue++;
      p_green++;
      p_red++;
      p_edges++;
    }
  }

  cv::Mat colorf, color;
  cv::merge(planes, colorf);
  colorf.convertTo(color, CV_8U, 255.0);
  
  // Done
  cv::imwrite(argv[argc-1], color);

  return EXIT_SUCCESS;
}